

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::CommissionerApp::GetJoinerUdpPort
          (Error *__return_storage_ptr__,CommissionerApp *this,uint16_t *aJoinerUdpPort,
          JoinerType aJoinerType)

{
  char *pcVar1;
  uint16_t uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar6;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  writer write;
  string local_b8;
  ErrorCode local_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  writer local_70;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  iVar3 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar3 == '\0') {
    local_68.types_[0] = none_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "the commissioner is not active";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    pcVar5 = "the commissioner is not active";
    local_68.context_.types_ = local_68.types_;
    do {
      pcVar4 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar5,"",&local_68);
      }
      pcVar5 = pcVar4;
    } while (pcVar4 != "");
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_(&local_b8,(v10 *)0x24ee20,(string_view)ZEXT816(0x1e),args_00);
    local_98 = kInvalidState;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
  }
  else if (aJoinerType == kNMKP) {
    if (((this->mCommDataset).mPresentFlags & 0x100) != 0) {
      uVar2 = (this->mCommDataset).mNmkpUdpPort;
      goto LAB_001ad723;
    }
    local_68.types_[0] = none_type;
    pcVar5 = "cannot find Thread CCM NMKP Port";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "cannot find Thread CCM NMKP Port";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x20;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_70.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (pcVar5 == "") break;
      pcVar4 = pcVar5;
      if (*pcVar5 == '{') {
LAB_001ad680:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_70,pcVar5,pcVar4);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",&local_68);
        bVar6 = true;
      }
      else {
        pcVar4 = pcVar5 + 1;
        bVar6 = pcVar4 != "";
        if (bVar6) {
          if (*pcVar4 != '{') {
            pcVar1 = pcVar5 + 2;
            do {
              pcVar4 = pcVar1;
              bVar6 = pcVar4 != "";
              if (pcVar4 == "") goto LAB_001ad67c;
              pcVar1 = pcVar4 + 1;
            } while (*pcVar4 != '{');
          }
          bVar6 = true;
        }
LAB_001ad67c:
        if (bVar6) goto LAB_001ad680;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_70,pcVar5,"");
        bVar6 = false;
      }
    } while (bVar6);
    args_02.field_1.args_ = in_R9.args_;
    args_02.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"cannot find Thread CCM NMKP Port",(string_view)ZEXT816(0x20),
               args_02);
    local_98 = kNotFound;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
  }
  else if (aJoinerType == kAE) {
    if (((this->mCommDataset).mPresentFlags & 0x200) != 0) {
      uVar2 = (this->mCommDataset).mAeUdpPort;
      goto LAB_001ad723;
    }
    local_68.types_[0] = none_type;
    pcVar5 = "cannot find Thread CCM AE UDP Port";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "cannot find Thread CCM AE UDP Port";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x22;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_70.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (pcVar5 == "") break;
      pcVar4 = pcVar5;
      if (*pcVar5 == '{') {
LAB_001ad568:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_70,pcVar5,pcVar4);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",&local_68);
        bVar6 = true;
      }
      else {
        pcVar4 = pcVar5 + 1;
        bVar6 = pcVar4 != "";
        if (bVar6) {
          if (*pcVar4 != '{') {
            pcVar1 = pcVar5 + 2;
            do {
              pcVar4 = pcVar1;
              bVar6 = pcVar4 != "";
              if (pcVar4 == "") goto LAB_001ad564;
              pcVar1 = pcVar4 + 1;
            } while (*pcVar4 != '{');
          }
          bVar6 = true;
        }
LAB_001ad564:
        if (bVar6) goto LAB_001ad568;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_70,pcVar5,"");
        bVar6 = false;
      }
    } while (bVar6);
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"cannot find Thread CCM AE UDP Port",(string_view)ZEXT816(0x22),
               args_01);
    local_98 = kNotFound;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
  }
  else {
    if (aJoinerType != kMeshCoP) {
      return __return_storage_ptr__;
    }
    if (((this->mCommDataset).mPresentFlags & 0x400) != 0) {
      uVar2 = (this->mCommDataset).mJoinerUdpPort;
LAB_001ad723:
      *aJoinerUdpPort = uVar2;
      return __return_storage_ptr__;
    }
    local_68.types_[0] = none_type;
    pcVar5 = "cannot find Thread 1.1 Joiner UDP Port";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "cannot find Thread 1.1 Joiner UDP Port";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x26;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_70.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (pcVar5 == "") break;
      pcVar4 = pcVar5;
      if (*pcVar5 == '{') {
LAB_001ad359:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_70,pcVar5,pcVar4);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",&local_68);
        bVar6 = true;
      }
      else {
        pcVar4 = pcVar5 + 1;
        bVar6 = pcVar4 != "";
        if (bVar6) {
          if (*pcVar4 != '{') {
            pcVar1 = pcVar5 + 2;
            do {
              pcVar4 = pcVar1;
              bVar6 = pcVar4 != "";
              if (pcVar4 == "") goto LAB_001ad355;
              pcVar1 = pcVar4 + 1;
            } while (*pcVar4 != '{');
          }
          bVar6 = true;
        }
LAB_001ad355:
        if (bVar6) goto LAB_001ad359;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_70,pcVar5,"");
        bVar6 = false;
      }
    } while (bVar6);
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b8,(v10 *)"cannot find Thread 1.1 Joiner UDP Port",(string_view)ZEXT816(0x26),
               args);
    local_98 = kNotFound;
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p + local_b8._M_string_length);
  }
  __return_storage_ptr__->mCode = local_98;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_90);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetJoinerUdpPort(uint16_t &aJoinerUdpPort, JoinerType aJoinerType) const
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    switch (aJoinerType)
    {
    case JoinerType::kMeshCoP:
        VerifyOrExit(mCommDataset.mPresentFlags & CommissionerDataset::kJoinerUdpPortBit,
                     error = ERROR_NOT_FOUND("cannot find Thread 1.1 Joiner UDP Port"));
        aJoinerUdpPort = mCommDataset.mJoinerUdpPort;
        break;

    case JoinerType::kAE:
        VerifyOrExit(mCommDataset.mPresentFlags & CommissionerDataset::kAeUdpPortBit,
                     error = ERROR_NOT_FOUND("cannot find Thread CCM AE UDP Port"));
        aJoinerUdpPort = mCommDataset.mAeUdpPort;
        break;

    case JoinerType::kNMKP:
        VerifyOrExit(mCommDataset.mPresentFlags & CommissionerDataset::kNmkpUdpPortBit,
                     error = ERROR_NOT_FOUND("cannot find Thread CCM NMKP Port"));
        aJoinerUdpPort = mCommDataset.mNmkpUdpPort;
        break;
    }

exit:
    return error;
}